

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_constraint.cpp
# Opt level: O2

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::CheckConstraint::Copy(CheckConstraint *this)

{
  _func_int **pp_Var1;
  pointer pPVar2;
  long in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_20;
  _func_int **local_18;
  
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 0x10));
  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_20,pPVar2);
  make_uniq<duckdb::CheckConstraint,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((duckdb *)&local_18,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_20);
  pp_Var1 = local_18;
  local_18 = (_func_int **)0x0;
  (this->super_Constraint)._vptr_Constraint = pp_Var1;
  if (local_20._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> CheckConstraint::Copy() const {
	return make_uniq<CheckConstraint>(expression->Copy());
}